

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O0

result_type __thiscall
Well<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_Detail::M3<28>,_Detail::M1,_Detail::M3<18>,_Detail::M3<3>,_Detail::M3<21>,_Detail::M3<-17>,_Detail::M3<-28>,_Detail::M3<-1>,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_Detail::M3<28>,_Detail::M1,_Detail::M3<18>,_Detail::M3<3>,_Detail::M3<21>,_Detail::M3<_17>,_Detail::M3<_28>,_Detail::M3<_1>,_Detail::NoTempering>
             *this)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint x;
  uint uVar6;
  uint uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  uint z4;
  uint z3;
  uint z2;
  uint z1;
  uint z0;
  size_t im3;
  size_t im2;
  size_t im1;
  size_t l;
  size_t k;
  size_t j;
  size_t i;
  uint lower_mask;
  uint upper_mask;
  Well<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_Detail::M3<28>,_Detail::M1,_Detail::M3<18>,_Detail::M3<3>,_Detail::M3<21>,_Detail::M3<_17>,_Detail::M3<_28>,_Detail::M3<_1>,_Detail::NoTempering>
  *this_local;
  
  sVar1 = this->index_;
  uVar8 = mod<unsigned_long>(sVar1 + 0x2d5);
  uVar9 = mod<unsigned_long>(sVar1 + 0x2d4);
  uVar6 = this->state_[uVar8];
  uVar7 = this->state_[uVar9];
  uVar2 = Detail::M3<28>::transform<unsigned_int>(this->state_[sVar1]);
  uVar3 = state(this,sVar1 + 0x29b);
  uVar3 = Detail::M1::transform<unsigned_int>(uVar3);
  uVar4 = state(this,sVar1 + 0x2b);
  uVar4 = Detail::M3<18>::transform<unsigned_int>(uVar4);
  uVar5 = state(this,sVar1 + 0x1ce);
  uVar5 = Detail::M3<3>::transform<unsigned_int>(uVar5);
  x = uVar2 ^ uVar3 ^ uVar4 ^ uVar5;
  uVar6 = Detail::M3<21>::transform<unsigned_int>(uVar6 & 0xff800000 | uVar7 & 0x7fffff);
  uVar7 = Detail::M3<-17>::transform<unsigned_int>(uVar2 ^ uVar3);
  uVar2 = Detail::M3<-28>::transform<unsigned_int>(uVar4 ^ uVar5);
  uVar3 = Detail::M3<-1>::transform<unsigned_int>(x);
  uVar3 = uVar6 ^ uVar7 ^ uVar2 ^ uVar3;
  this->state_[sVar1] = x;
  this->state_[uVar8] = uVar3;
  this->index_ = uVar8;
  uVar6 = Detail::NoTempering::apply<726ul,unsigned_int,726ul>(uVar3,this->state_,sVar1 + 0x2b);
  return uVar6;
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }